

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O0

char sc_core::map_sc_logic_state_to_vcd_state(char in_char)

{
  char out_char;
  char in_char_local;
  
  switch(in_char) {
  case '0':
  case 'L':
    out_char = '0';
    break;
  case '1':
  case 'H':
    out_char = '1';
    break;
  default:
    out_char = '?';
    break;
  case 'D':
  case 'U':
  case 'W':
  case 'X':
    out_char = 'x';
    break;
  case 'Z':
    out_char = 'z';
  }
  return out_char;
}

Assistant:

static char
map_sc_logic_state_to_vcd_state(char in_char)
{
    char out_char;

    switch(in_char){
        case 'U':
        case 'X':
        case 'W':
        case 'D':
            out_char = 'x';
            break;
        case '0':
        case 'L':
            out_char = '0';
            break;
        case  '1':
        case  'H':
            out_char = '1';
            break;
        case  'Z':
            out_char = 'z';
            break;
        default:
            out_char = '?';
    }

    return out_char;
}